

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_cremate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int dam;
  
  dam = dice(level,7);
  act("$n is engulfed in raging fire!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
  send_to_char("You are engulfed in raging fire!\n\r",(CHAR_DATA *)vo);
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,4);
  if (bVar1) {
    dam = dam / 2;
  }
  damage_old(ch,(CHAR_DATA *)vo,dam,sn,4,true);
  return;
}

Assistant:

void spell_cremate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;

	dam = dice(level, 7);

	act("$n is engulfed in raging fire!", victim, 0, 0, TO_ROOM);
	send_to_char("You are engulfed in raging fire!\n\r", victim);

	if (saves_spell(level, victim, DAM_FIRE))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_FIRE, true);
}